

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

TranslationBlock *
tb_gen_code_ppc64(CPUState *cpu,target_ulong pc,target_ulong cs_base,uint32_t flags,int cflags)

{
  ushort uVar1;
  TCGContext_conflict6 *s;
  CPUArchState_conflict23 *env;
  void *pvVar2;
  TCGContext_conflict6 *pTVar3;
  uint8_t *puVar4;
  uc_struct_conflict7 *uc;
  tb_page_addr_t phys1;
  uint32_t hash;
  TranslationBlock *tb;
  uint8_t *p_00;
  tb_page_addr_t phys2;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  TranslationBlock *pTVar11;
  uint local_ac;
  PageDesc *p2;
  uint32_t local_80;
  uint32_t local_7c;
  void *local_78;
  PageDesc *p;
  CPUArchState_conflict23 *local_68;
  tb_page_addr_t local_60;
  uint8_t *local_58;
  size_t local_50;
  target_ulong local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  s = cpu->uc->tcg_ctx;
  env = (CPUArchState_conflict23 *)cpu->env_ptr;
  local_7c = flags;
  local_48 = cs_base;
  local_60 = get_page_addr_code_ppc64(env,pc);
  uVar9 = cflags | 0x10000;
  if (local_60 != 0xffffffffffffffff) {
    uVar9 = cflags;
  }
  local_80 = cpu->cluster_index << 0x18 | uVar9 & 0xffffff;
  uVar9 = uVar9 & 0x7fff;
  uVar8 = 0x200;
  if (uVar9 < 0x200) {
    uVar8 = uVar9;
  }
  if (uVar9 == 0) {
    uVar8 = 0x200;
  }
  local_ac = 1;
  if (cpu->singlestep_enabled == 0) {
    local_ac = uVar8;
  }
  local_40 = (CPUState *)&env[-1].spr_cb[0x1bf].oea_write;
  local_68 = env;
LAB_009d80e7:
  do {
    tb = tcg_tb_alloc_ppc64((TCGContext_conflict10 *)s);
    if (tb == (TranslationBlock *)0x0) {
      tb_flush_ppc64(cpu);
      cpu->exception_index = 0x10000;
      cpu_loop_exit_ppc64(cpu);
    }
    pvVar2 = s->code_gen_ptr;
    (tb->tc).ptr = pvVar2;
    tb->pc = pc;
    tb->cs_base = local_48;
    tb->flags = local_7c;
    tb->cflags = local_80;
    tb->orig_tb = (TranslationBlock *)0x0;
    tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
    s->tb_cflags = local_80;
    while( true ) {
      tcg_func_start_ppc64((TCGContext_conflict10 *)s);
      s->cpu = local_40;
      gen_intermediate_code_ppc64(cpu,tb,local_ac);
      s->cpu = (CPUState *)0x0;
      tb->jmp_reset_offset[0] = 0xffff;
      tb->jmp_reset_offset[1] = 0xffff;
      s->tb_jmp_reset_offset = tb->jmp_reset_offset;
      s->tb_jmp_insn_offset = tb->jmp_target_arg;
      s->tb_jmp_target_addr = (uintptr_t *)0x0;
      uVar9 = tcg_gen_code_ppc64((TCGContext_conflict10 *)s,tb);
      if (-1 < (int)uVar9) break;
      if (uVar9 != 0xfffffffe) {
        if (uVar9 != 0xffffffff) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x711,(char *)0x0);
        }
        goto LAB_009d80e7;
      }
      local_ac = (uint)(tb->icount >> 1);
      if (tb->icount < 2) {
        __assert_fail("max_insns > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x70c,
                      "TranslationBlock *tb_gen_code_ppc64(CPUState *, target_ulong, target_ulong, uint32_t, int)"
                     );
      }
    }
    local_50 = (size_t)uVar9;
    p_00 = (uint8_t *)(local_50 + (long)pvVar2);
    pTVar3 = cpu->uc->tcg_ctx;
    puVar4 = (uint8_t *)pTVar3->code_gen_highwater;
    uVar1 = tb->icount;
    uVar10 = 0;
    local_78 = pvVar2;
    local_58 = p_00;
    do {
      if (uVar10 == uVar1) {
        uVar9 = (int)p_00 - (int)local_58;
        if (-1 < (int)uVar9) {
          (tb->tc).size = local_50;
          s->code_gen_ptr =
               (void *)((long)local_78 + (uVar9 & 0x7fffffff) + local_50 + 0xf & 0xfffffffffffffff0)
          ;
          tb->jmp_dest[1] = 0;
          *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
          tb->jmp_list_head = 0;
          tb->jmp_list_next[0] = 0;
          if (tb->jmp_reset_offset[0] != 0xffff) {
            tb_reset_jump(tb,0);
          }
          phys1 = local_60;
          if (tb->jmp_reset_offset[1] != 0xffff) {
            tb_reset_jump(tb,1);
          }
          uVar10 = (pc + tb->size) - 1 & 0xfffffffffffff000;
          if ((pc & 0xfffffffffffff000) == uVar10) {
            phys2 = 0xffffffffffffffff;
          }
          else {
            phys2 = get_page_addr_code_ppc64(local_68,uVar10);
          }
          uc = cpu->uc;
          p2 = (PageDesc *)0x0;
          if (phys1 == 0xffffffffffffffff) {
            if ((tb->cflags & 0x10000) == 0) {
              __assert_fail("tb->cflags & CF_NOCACHE",
                            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                            ,0x66c,
                            "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                           );
            }
            *(undefined4 *)tb->page_addr = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
            *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
          }
          else {
            page_lock_pair((uc_struct_conflict11 *)uc,&p,phys1,&p2,phys2,1);
            tb_page_add((uc_struct_conflict11 *)uc,p,tb,0,phys1 & 0xfffffffffffff000);
            if (p2 == (PageDesc *)0x0) {
              tb->page_addr[1] = 0xffffffffffffffff;
            }
            else {
              tb_page_add((uc_struct_conflict11 *)uc,p2,tb,1,phys2);
            }
            if ((tb->cflags >> 0x10 & 1) == 0) {
              local_38 = (TranslationBlock *)0x0;
              hash = tb_hash_func(phys1,tb->pc,tb->flags,tb->cflags & 0xff0affff,
                                  tb->trace_vcpu_dstate);
              tb->hash = hash;
              qht_insert((uc_struct_conflict5 *)uc,(qht *)(uc->tcg_ctx->gen_insn_data[0xaa] + 2),tb,
                         hash,&local_38);
              if (local_38 != (TranslationBlock *)0x0) {
                tb_page_remove(p,tb);
                invalidate_page_bitmap(p);
                if (p2 != (PageDesc *)0x0) {
                  tb_page_remove(p2,tb);
                  invalidate_page_bitmap(p2);
                }
                if (local_38 != tb) {
                  lVar7 = (long)((uc_struct_conflict11 *)s->gen_insn_data[0xb2][1])->
                                qemu_icache_linesize;
                  s->code_gen_ptr = (void *)((long)local_78 - (-lVar7 & lVar7 + 0x9fU));
                  return local_38;
                }
              }
            }
          }
          tcg_tb_insert_ppc64((TCGContext_conflict10 *)s,tb);
          return tb;
        }
        break;
      }
      pTVar11 = (TranslationBlock *)((long)(pTVar3->gen_insn_data + -1) + (uVar10 * 4 + 8) * 2);
      if (uVar10 == 0) {
        pTVar11 = tb;
      }
      bVar5 = true;
      while (bVar5) {
        p_00 = encode_sleb128(p_00,pTVar3->gen_insn_data[0][uVar10] - pTVar11->pc);
        bVar5 = false;
      }
      if (uVar10 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)pTVar3->gen_insn_end_off[uVar10 - 1];
      }
      p_00 = encode_sleb128(p_00,pTVar3->gen_insn_end_off[uVar10] - uVar6);
      uVar10 = uVar10 + 1;
    } while (p_00 <= puVar4);
  } while( true );
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}